

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O1

void __thiscall FixedBuffer<4000>::append(FixedBuffer<4000> *this,char *buf,size_t len)

{
  char **ppcVar1;
  
  ppcVar1 = &this->cur_;
  if ((int)len < (int)ppcVar1 - (int)this->cur_) {
    memcpy(this->cur_,buf,len);
    *ppcVar1 = *ppcVar1 + len;
  }
  return;
}

Assistant:

void append(const char* buf, size_t len){
        if(avail() > static_cast<int>(len)){
            memcpy(cur_, buf, len);
            cur_+=len;
        }
    }